

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

int __thiscall ON_wString::Count(ON_wString *this,wchar_t ch)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  wchar_t *local_20;
  wchar_t *p;
  int count;
  wchar_t ch_local;
  ON_wString *this_local;
  
  p._0_4_ = 0;
  local_20 = this->m_s;
  while (*local_20 != L'\0') {
    pwVar2 = local_20 + 1;
    wVar1 = *local_20;
    local_20 = pwVar2;
    if (wVar1 == ch) {
      p._0_4_ = (int)p + 1;
    }
  }
  return (int)p;
}

Assistant:

int ON_wString::Count(wchar_t ch) const
{
  int count = 0;

  const wchar_t* p = m_s;
  while (*p != 0)
  {
    if (*p++ == ch)
      count++;
  }

  return count;
}